

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int load_ge(secp256k1_ge *ge,uint8_t *data,size_t len)

{
  int iVar1;
  secp256k1_fe fe;
  secp256k1_fe local_40;
  
  if ((*data & 0xfe) == 8) {
    secp256k1_fe_set_b32(&local_40,data + 1);
    secp256k1_ge_set_xquad(ge,&local_40);
    if ((*data & 1) != 0) {
      secp256k1_ge_neg(ge,ge);
    }
    return 1;
  }
  iVar1 = secp256k1_eckey_pubkey_parse(ge,data,0x21);
  return iVar1;
}

Assistant:

static int load_ge(secp256k1_ge *ge, const uint8_t *data, size_t len)
{
    if (len == 33 && (data[0] == 0x08 || data[0] == 0x09)) {
        pedersen_commitment_load(ge, data);
        return 1;
    }
    return secp256k1_eckey_pubkey_parse(ge, data, len);
}